

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator%=(ZZ<130UL> *this,word wRight)

{
  ZZ<130UL> *pZVar1;
  ZZ<130UL> *in_RSI;
  word in_RDI;
  word *in_stack_00000018;
  ZZ<130UL> *in_stack_00000020;
  
  Div(in_stack_00000020,in_stack_00000018);
  pZVar1 = operator=(in_RSI,in_RDI);
  return pZVar1;
}

Assistant:

ZZ& operator%=(word wRight)
	{	
		Div(wRight);
		return operator=(wRight);
	}